

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O2

void __thiscall
Assimp::IFC::anon_unknown_9::CompositeCurve::SampleDiscrete
          (CompositeCurve *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  pointer ppVar1;
  pointer paVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  CurveEntry *entry;
  pointer ppVar6;
  
  bVar3 = Curve::InRange((Curve *)this,a);
  if (!bVar3) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x119,
                  "virtual void Assimp::IFC::(anonymous namespace)::CompositeCurve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  bVar3 = Curve::InRange((Curve *)this,b);
  if (bVar3) {
    iVar4 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[6])(a,b,this);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&out->mVerts,
               CONCAT44(extraout_var,iVar4) +
               ((long)(out->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(out->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    ppVar1 = (this->curves).
             super__Vector_base<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar6 = (this->curves).
                  super__Vector_base<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar1; ppVar6 = ppVar6 + 1)
    {
      lVar5 = (long)(out->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(out->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      BoundedCurve::SampleDiscrete
                ((ppVar6->first).
                 super___shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 out);
      if (ppVar6->second == false) {
        paVar2 = (out->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (lVar5 != (long)(out->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2) {
          std::
          __reverse<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                    ((long)paVar2 + lVar5);
        }
      }
    }
    return;
  }
  __assert_fail("InRange( b )",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0x11a,
                "virtual void Assimp::IFC::(anonymous namespace)::CompositeCurve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
               );
}

Assistant:

void SampleDiscrete(TempMesh& out,IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );

        const size_t cnt = EstimateSampleCount(a,b);
        out.mVerts.reserve(out.mVerts.size() + cnt);

        for(const CurveEntry& entry : curves) {
            const size_t cnt = out.mVerts.size();
            entry.first->SampleDiscrete(out);

            if (!entry.second && cnt != out.mVerts.size()) {
                std::reverse(out.mVerts.begin()+cnt,out.mVerts.end());
            }
        }
    }